

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O2

basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> * __thiscall
ptc::Print<char16_t>::operator()
          (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
           *__return_storage_ptr__,Print<char16_t> *this,mode *first,char (*args) [8],
          char (*args_1) [5])

{
  int iVar1;
  conditional_t<std::is_same_v<char16_t,_char>,_const_std::basic_string<char16_t>_&,_std::basic_string<char16_t>_>
  cStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (*first == str) {
    if (operator()<char_const(&)[8],char_const(&)[5]>(ptc::mode&&,char_const&[],char_const&[])::
        oss_abi_cxx11_ == '\0') {
      iVar1 = __cxa_guard_acquire(&operator()<char_const(&)[8],char_const(&)[5]>(ptc::mode&&,char_const&[],char_const&[])
                                   ::oss_abi_cxx11_);
      if (iVar1 != 0) {
        std::__cxx11::
        basic_ostringstream<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
        basic_ostringstream(&operator()<char_const(&)[8],char_const(&)[5]>(ptc::mode&&,char_const&[],char_const&[])
                             ::oss_abi_cxx11_);
        __cxa_atexit(std::__cxx11::
                     basic_ostringstream<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                     ::~basic_ostringstream,
                     &operator()<char_const(&)[8],char_const(&)[5]>(ptc::mode&&,char_const&[],char_const&[])
                      ::oss_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&operator()<char_const(&)[8],char_const(&)[5]>(ptc::mode&&,char_const&[],char_const&[])
                             ::oss_abi_cxx11_);
      }
    }
    s_abi_cxx11_(&local_48,"",0);
    anon_unknown_8::StringConverter<char16_t>(&cStack_68,&local_48);
    std::__cxx11::basic_stringbuf<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
    str((basic_stringbuf<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
        &operator()<char_const(&)[8],char_const(&)[5]>(ptc::mode&&,char_const&[],char_const&[])::
         oss_abi_cxx11_.super_basic_ostream<char16_t,_std::char_traits<char16_t>_>.field_0x8,
        &cStack_68);
    std::__cxx11::u16string::~u16string((u16string *)&cStack_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::basic_ios<char16_t,_std::char_traits<char16_t>_>::clear
              ((basic_ios<char16_t,_std::char_traits<char16_t>_> *)
               (operator()<char_const(&)[8],char_const(&)[5]>(ptc::mode&&,char_const&[],char_const&[])
                ::oss_abi_cxx11_.super_basic_ostream<char16_t,_std::char_traits<char16_t>_>.
                _vptr_basic_ostream[-3] + 0x1540a0),_S_goodbit);
    print_backend<std::__cxx11::basic_ostringstream<char16_t,std::char_traits<char16_t>,std::allocator<char16_t>>&,char_const(&)[8],char_const(&)[5]>
              (this,&operator()<char_const(&)[8],char_const(&)[5]>(ptc::mode&&,char_const&[],char_const&[])
                     ::oss_abi_cxx11_,args,args_1);
    std::__cxx11::basic_stringbuf<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
    str(__return_storage_ptr__,
        (basic_stringbuf<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
        &operator()<char_const(&)[8],char_const(&)[5]>(ptc::mode&&,char_const&[],char_const&[])::
         oss_abi_cxx11_.super_basic_ostream<char16_t,_std::char_traits<char16_t>_>.field_0x8);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cStack_68,"",(allocator<char> *)&local_48);
    anon_unknown_8::StringConverter<char16_t>(__return_storage_ptr__,(string *)&cStack_68);
    std::__cxx11::string::~string((string *)&cStack_68);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::basic_string<T_str> operator()( mode&& first, Args&&... args ) const
     { 
      if constexpr( sizeof...( args ) > 0 )
       {
        switch( first )
         {
          case mode::str:
           {
            static std::basic_ostringstream<T_str> oss;
            oss.str( StringConverter<T_str>( ""s ) );
            oss.clear();
            print_backend( oss, std::forward<Args>( args )... );

            return oss.str();
           }
         }
       }
       
      return StringConverter<T_str>( "" );
     }